

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nicdrv.c
# Opt level: O0

int ecx_getindex(ecx_portt *port)

{
  int local_18;
  int local_14;
  int cnt;
  int idx;
  ecx_portt *port_local;
  
  pthread_mutex_lock((pthread_mutex_t *)&port->getindex_mutex);
  local_14 = port->lastidx + 1;
  if (0xf < local_14) {
    local_14 = 0;
  }
  local_18 = 0;
  while (port->rxbufstat[local_14] != 0 && local_18 < 0x10) {
    local_14 = local_14 + 1;
    local_18 = local_18 + 1;
    if (0xf < local_14) {
      local_14 = 0;
    }
  }
  port->rxbufstat[local_14] = 1;
  if (port->redstate != 0) {
    port->redport->rxbufstat[local_14] = 1;
  }
  port->lastidx = local_14;
  pthread_mutex_unlock((pthread_mutex_t *)&port->getindex_mutex);
  return local_14;
}

Assistant:

int ecx_getindex(ecx_portt *port)
{
   int idx;
   int cnt;
#ifdef RTNET
   rt_mutex_acquire(&port->getindex_mutex, TM_INFINITE);
#else
   pthread_mutex_lock( &(port->getindex_mutex) );
#endif //RTNET

   idx = port->lastidx + 1;
   /* index can't be larger than buffer array */
   if (idx >= EC_MAXBUF) 
   {
      idx = 0;
   }
   cnt = 0;
   /* try to find unused index */
   while ((port->rxbufstat[idx] != EC_BUF_EMPTY) && (cnt < EC_MAXBUF))
   {
      idx++;
      cnt++;
      if (idx >= EC_MAXBUF) 
      {
         idx = 0;
      }
   }
   port->rxbufstat[idx] = EC_BUF_ALLOC;
   if (port->redstate != ECT_RED_NONE)
      port->redport->rxbufstat[idx] = EC_BUF_ALLOC;
   port->lastidx = idx;
#ifdef RTNET
   rt_mutex_release(&port->getindex_mutex);
#else
   pthread_mutex_unlock( &(port->getindex_mutex) );
#endif
   return idx;
}